

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  const_reference pvVar3;
  ostream *poVar4;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3a8;
  string local_378;
  string local_358;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_338;
  string local_308;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  _Base_ptr local_238;
  undefined1 local_230;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  string_type local_1e8;
  string_type local_1c8;
  allocator local_1a1;
  undefined1 local_1a0 [8];
  string option;
  undefined1 local_178 [4];
  int option_param_index;
  string value;
  string op_param;
  smatch matches;
  regex option_regex;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  optional_params;
  string local_c0 [8];
  string required_param;
  undefined1 local_98 [8];
  string action_1;
  string local_70;
  allocator local_39;
  undefined1 local_38 [8];
  string action;
  char **argv_local;
  int argc_local;
  
  action.field_2._8_8_ = argv;
  if (argc == 1) {
    cli_intro_section();
  }
  else if (argc == 2) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"--help");
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"-h"), bVar2)) {
      cli_help_section();
    }
    else {
      pcVar1 = *(char **)(action.field_2._8_8_ + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_70,pcVar1,(allocator *)(action_1.field_2._M_local_buf + 0xf));
      cli_action_detect(&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)(action_1.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  else if (2 < argc) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_98,pcVar1,(allocator *)(required_param.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(required_param.field_2._M_local_buf + 0xf))
    ;
    pcVar1 = *(char **)(action.field_2._8_8_ + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,pcVar1,
               (allocator *)
               ((long)&optional_params._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&optional_params._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&option_regex._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
    if (3 < argc) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&matches._M_begin,
                 "--(%?[A-Za-z0-9_-]+)=\"?(.+?)\"?",0x10);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)((long)&op_param.field_2 + 8));
      std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_178);
      for (option.field_2._12_4_ = 3; (int)option.field_2._12_4_ < argc;
          option.field_2._12_4_ = option.field_2._12_4_ + 1) {
        pcVar1 = *(char **)(action.field_2._8_8_ + (long)(int)option.field_2._12_4_ * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_1a0,pcVar1,&local_1a1);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
        bVar2 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a0,
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)((long)&op_param.field_2 + 8),
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&matches._M_begin
                           ,0);
        if (bVar2) {
          pvVar3 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)((long)&op_param.field_2 + 8),1);
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(&local_1c8,pvVar3);
          std::__cxx11::string::operator=
                    ((string *)(value.field_2._M_local_buf + 8),(string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          pvVar3 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)((long)&op_param.field_2 + 8),2);
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(&local_1e8,pvVar3);
          std::__cxx11::string::operator=((string *)local_178,(string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                    (&local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&value.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178)
          ;
          _Var5 = std::
                  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                            ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              *)&option_regex._M_automaton.
                                 super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount,&local_228);
          local_238 = (_Base_ptr)_Var5.first._M_node;
          local_230 = _Var5.second;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_228);
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_1a0);
          std::__cxx11::to_string(&local_298,option.field_2._12_4_);
          std::operator+(&local_278," at index ",&local_298);
          std::operator+(&local_258,&local_278," is not detected as an option");
          poVar4 = std::operator<<(poVar4,(string *)&local_258);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_298);
        }
        std::__cxx11::string::~string((string *)local_1a0);
      }
      std::__cxx11::string::~string((string *)local_178);
      std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)((long)&op_param.field_2 + 8));
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&matches._M_begin);
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"CREATE");
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_98,"create"), bVar2)) {
      std::__cxx11::string::string((string *)&local_2b8,local_c0);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&local_2e8,
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&option_regex._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
      create(&local_2b8,&local_2e8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map(&local_2e8);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_98,"UPDATE");
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_98,"update"), bVar2)) {
        std::__cxx11::string::string((string *)&local_308,local_c0);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map(&local_338,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&option_regex._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
        update(&local_308,&local_338);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map(&local_338);
        std::__cxx11::string::~string((string *)&local_308);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_98,"RESET");
        if ((bVar2) ||
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_98,"reset"), bVar2)) {
          std::__cxx11::string::string((string *)&local_358,local_c0);
          reset(&local_358);
          std::__cxx11::string::~string((string *)&local_358);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_98,"EXTRACT");
          if ((bVar2) ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_98,"extract"), bVar2)) {
            std::__cxx11::string::string((string *)&local_378,local_c0);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::map(&local_3a8,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&option_regex._M_automaton.
                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
            extract(&local_378,&local_3a8);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~map(&local_3a8);
            std::__cxx11::string::~string((string *)&local_378);
          }
        }
      }
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&option_regex._M_automaton.
               super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string((string *)local_98);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
     if (argc == 1) {
         cli_intro_section();
         return 0;
     }
     else if (argc == 2) {
         std::string action = argv[1];
         if (action == "--help" || action == "-h")
             cli_help_section();
         else
             cli_action_detect(argv[1]);
     }
     else if (argc >= 3) {
         std::string action = argv[1];
         std::string required_param = argv[2];

         std::map<std::string, std::string> optional_params;
         if (argc >= 4) {
             std::regex option_regex("--(%?[A-Za-z0-9_-]+)=\"?(.+?)\"?");
             std::smatch matches;
             std::string op_param, value;
             for (int option_param_index = 3; option_param_index < argc; option_param_index++) {
                 std::string option = argv[option_param_index];
                 if (std::regex_match(option, matches, option_regex)) {
                     op_param = matches[1].str();
                     value = matches[2].str();
                     optional_params.insert(std::make_pair(op_param, value));
                 }
                 else
                     std::cout << option << " at index " + std::to_string(option_param_index) +  " is not detected as an option" << std::endl;
             }
         }

         if (action == "CREATE" || action == "create")
             create(required_param, optional_params);
         else if (action == "UPDATE" || action == "update")
             update(required_param, optional_params);
         else if (action == "RESET" || action == "reset")
             reset(required_param);
         else if (action == "EXTRACT" || action == "extract")
             extract(required_param, optional_params);
        
         return 0;
     }
 }